

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O0

int xsurv0_pipe_start(void *arg)

{
  nni_list *list;
  uint16_t uVar1;
  xsurv0_sock *s;
  xsurv0_pipe *p;
  void *arg_local;
  
  list = *(nni_list **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 99) {
    nni_mtx_lock((nni_mtx *)&list[0x14].ll_offset);
    nni_list_append(list,arg);
    nni_mtx_unlock((nni_mtx *)&list[0x14].ll_offset);
    nni_msgq_aio_get(*(nni_msgq **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x28));
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x580));
    arg_local._4_4_ = 0;
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,99);
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
xsurv0_pipe_start(void *arg)
{
	xsurv0_pipe *p = arg;
	xsurv0_sock *s = p->psock;

	if (nni_pipe_peer(p->npipe) != SURVEYOR0_PEER) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->npipe), SURVEYOR0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	nni_list_append(&s->pipes, p);
	nni_mtx_unlock(&s->mtx);

	nni_msgq_aio_get(p->sendq, &p->aio_getq);
	nni_pipe_recv(p->npipe, &p->aio_recv);
	return (0);
}